

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall QIconModeViewBase::itemIndex(QIconModeViewBase *this,QListViewItem *item)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  QListViewItem *in_RSI;
  long in_RDI;
  bool b;
  bool a;
  int c;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffc0;
  undefined3 uVar7;
  uint in_stack_ffffffffffffffc4;
  QListViewItem *in_stack_ffffffffffffffc8;
  bool local_26;
  uint local_20;
  uint local_1c;
  uint local_4;
  
  bVar1 = QListViewItem::isValid(in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_1c = in_RSI->indexHint;
    lVar3 = (long)(int)local_1c;
    qVar4 = QList<QListViewItem>::size((QList<QListViewItem> *)(in_RDI + 0x60));
    if (lVar3 < qVar4) {
      pQVar5 = QList<QListViewItem>::at
                         ((QList<QListViewItem> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar1 = QListViewItem::operator==(pQVar5,in_RSI);
      if (bVar1) {
        return local_1c;
      }
    }
    else {
      qVar4 = QList<QListViewItem>::size((QList<QListViewItem> *)(in_RDI + 0x60));
      local_1c = (int)qVar4 - 1;
    }
    local_20 = local_1c;
    qVar4 = QList<QListViewItem>::size((QList<QListViewItem> *)(in_RDI + 0x60));
    bVar1 = true;
    local_26 = true;
    while( true ) {
      do {
        uVar7 = (undefined3)in_stack_ffffffffffffffc4;
        in_stack_ffffffffffffffc4 = CONCAT13(1,uVar7);
        if (!bVar1) {
          in_stack_ffffffffffffffc4 = CONCAT13(local_26,uVar7);
        }
        if ((in_stack_ffffffffffffffc4 & 0x1000000) == 0) {
          return -1;
        }
        if (bVar1) {
          pQVar5 = QList<QListViewItem>::at
                             ((QList<QListViewItem> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          bVar1 = QListViewItem::operator==(pQVar5,in_RSI);
          if (bVar1) {
            uVar6 = local_1c;
            pQVar5 = QList<QListViewItem>::at
                               ((QList<QListViewItem> *)CONCAT44(in_stack_ffffffffffffffc4,local_1c)
                                ,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
            pQVar5->indexHint = uVar6;
            return local_1c;
          }
          local_1c = local_1c + 1;
          bVar1 = (int)local_1c < (int)qVar4;
        }
      } while (local_26 == false);
      pQVar5 = QList<QListViewItem>::at
                         ((QList<QListViewItem> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar2 = QListViewItem::operator==(pQVar5,in_RSI);
      if (bVar2) break;
      local_20 = local_20 - 1;
      local_26 = local_20 < 0x80000000;
    }
    uVar6 = local_20;
    pQVar5 = QList<QListViewItem>::at
                       ((QList<QListViewItem> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT44(local_20,in_stack_ffffffffffffffb8));
    pQVar5->indexHint = uVar6;
    local_4 = local_20;
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int QIconModeViewBase::itemIndex(const QListViewItem &item) const
{
    if (!item.isValid())
        return -1;
    int i = item.indexHint;
    if (i < items.size()) {
        if (items.at(i) == item)
            return i;
    } else {
        i = items.size() - 1;
    }

    int j = i;
    int c = items.size();
    bool a = true;
    bool b = true;

    while (a || b) {
        if (a) {
            if (items.at(i) == item) {
                items.at(i).indexHint = i;
                return i;
            }
            a = ++i < c;
        }
        if (b) {
            if (items.at(j) == item) {
                items.at(j).indexHint = j;
                return j;
            }
            b = --j > -1;
        }
    }
    return -1;
}